

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O0

void __thiscall ImGuizmo::vec_t::Transform(vec_t *this,matrix_t *matrix)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  vec_t out;
  matrix_t *matrix_local;
  vec_t *this_local;
  
  fVar1 = this->x;
  fVar2 = (matrix->field_0).m[0][1];
  fVar3 = (matrix->field_0).m[1][1];
  fVar4 = (matrix->field_0).m[2][1];
  fVar5 = (matrix->field_0).m[3][1];
  fVar6 = this->x;
  fVar7 = (matrix->field_0).m[0][2];
  fVar8 = this->y;
  fVar9 = (matrix->field_0).m[1][2];
  fVar10 = (matrix->field_0).m[2][2];
  fVar11 = (matrix->field_0).m[3][2];
  fVar12 = this->x;
  fVar13 = (matrix->field_0).m[0][3];
  fVar14 = this->y;
  fVar15 = (matrix->field_0).m[1][3];
  fVar16 = this->z;
  fVar17 = (matrix->field_0).m[2][3];
  fVar18 = (matrix->field_0).m[3][3];
  this->x = this->w * (matrix->field_0).m[3][0] +
            this->z * (matrix->field_0).m[2][0] +
            this->x * (matrix->field_0).m[0][0] + this->y * (matrix->field_0).m[1][0];
  this->y = this->w * fVar5 + this->z * fVar4 + fVar1 * fVar2 + this->y * fVar3;
  this->z = this->w * fVar11 + this->z * fVar10 + fVar6 * fVar7 + fVar8 * fVar9;
  this->w = this->w * fVar18 + fVar16 * fVar17 + fVar12 * fVar13 + fVar14 * fVar15;
  return;
}

Assistant:

void vec_t::Transform(const matrix_t& matrix)
   {
      vec_t out;

      out.x = x * matrix.m[0][0] + y * matrix.m[1][0] + z * matrix.m[2][0] + w * matrix.m[3][0];
      out.y = x * matrix.m[0][1] + y * matrix.m[1][1] + z * matrix.m[2][1] + w * matrix.m[3][1];
      out.z = x * matrix.m[0][2] + y * matrix.m[1][2] + z * matrix.m[2][2] + w * matrix.m[3][2];
      out.w = x * matrix.m[0][3] + y * matrix.m[1][3] + z * matrix.m[2][3] + w * matrix.m[3][3];

      x = out.x;
      y = out.y;
      z = out.z;
      w = out.w;
   }